

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_gb16(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = in->a;
  if ((int)uVar1 < 1) {
    uVar1 = back->ig;
  }
  else {
    if (uVar1 < 0xffff) {
      dVar2 = (1.0 - (double)(int)uVar1 / 65535.0) * back->dg +
              (double)in->g * (((double)(int)uVar1 / 65535.0) / 65535.0);
    }
    else {
      dVar2 = (double)in->g / 65535.0;
    }
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    uVar1 = (int)dVar2 & 0xff;
  }
  out->b = uVar1;
  out->g = uVar1;
  out->r = uVar1;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_gb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else if (in->a >= 65535)
      out->r = out->g = out->b = isRGB(in->g);

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}